

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::unsetWindowFrameMargins(QWindow *this)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<Qt::WindowType> QVar3;
  Int IVar4;
  int iVar5;
  QGraphicsWidgetPrivate *left;
  QStyle *right;
  QStyleOptionTitleBar *in_RDI;
  long in_FS_OFFSET;
  double bottom;
  qreal titleBarHeight;
  qreal margin;
  QStyle *style;
  QGraphicsWidgetPrivate *d;
  QStyleOptionTitleBar bar;
  WindowType in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  QFlagsStorage<Qt::WindowType> lhs;
  QGraphicsWidgetPrivate *in_stack_ffffffffffffff50;
  qreal in_stack_ffffffffffffff58;
  qreal in_stack_ffffffffffffff60;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff68;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff6c;
  QStyleOptionTitleBar *this_00;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff80;
  QGraphicsWidgetPrivate *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  left = d_func((QGraphicsWidget *)0xa4bd20);
  QVar3.i = (Int)QFlags<Qt::WindowType>::operator&
                           ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffff3c);
  IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff84);
  lhs.i = in_stack_ffffffffffffff4c & 0xffffff;
  if (IVar4 != 0) {
    in_stack_ffffffffffffff6c.i =
         (Int)QFlags<Qt::WindowType>::operator&
                        ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffff3c);
    bVar2 = ::operator!=((QFlags<Qt::WindowType>)lhs.i,(WindowType)in_RDI);
    lhs.i = lhs.i & 0xffffff;
    if (bVar2) {
      in_stack_ffffffffffffff68.i =
           (Int)QFlags<Qt::WindowType>::operator&
                          ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffff3c);
      bVar2 = ::operator!=((QFlags<Qt::WindowType>)lhs.i,(WindowType)in_RDI);
      lhs.i = lhs.i & 0xffffff;
      if (bVar2) {
        in_stack_ffffffffffffff80.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)in_RDI,in_stack_ffffffffffffff3c);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xffffffffffffff80);
        lhs.i = CONCAT13(bVar2,(int3)lhs.i);
      }
    }
  }
  if ((char)(lhs.i >> 0x18) == '\0') {
    setWindowFrameMargins
              ((QWindow *)this_00,(qreal)left,
               (qreal)CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68.i),
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    memset(&stack0xffffffffffffff88,0xaa,0x70);
    QStyleOptionTitleBar::QStyleOptionTitleBar((QStyleOptionTitleBar *)0xa4be1b);
    QGraphicsWidgetPrivate::initStyleOptionTitleBar
              (in_stack_ffffffffffffff88,
               (QStyleOptionTitleBar *)CONCAT44(QVar3.i,in_stack_ffffffffffffff80.i));
    right = QGraphicsWidget::style((QGraphicsWidget *)CONCAT44(lhs.i,in_stack_ffffffffffffff48));
    iVar5 = (**(code **)(*(long *)right + 0xe0))(right,0x2c,&stack0xffffffffffffff88,0);
    bottom = (double)iVar5;
    QGraphicsWidgetPrivate::titleBarHeight
              (in_stack_ffffffffffffff50,
               (QStyleOptionTitleBar *)CONCAT44(lhs.i,in_stack_ffffffffffffff48));
    setWindowFrameMargins
              ((QWindow *)this_00,(qreal)left,
               (qreal)CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68.i),(qreal)right
               ,bottom);
    QStyleOptionTitleBar::~QStyleOptionTitleBar(in_RDI);
  }
  left->setWindowFrameMargins = false;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidget::unsetWindowFrameMargins()
{
    Q_D(QGraphicsWidget);
    if ((d->windowFlags & Qt::Window) && (d->windowFlags & Qt::WindowType_Mask) != Qt::Popup &&
         (d->windowFlags & Qt::WindowType_Mask) != Qt::ToolTip && !(d->windowFlags & Qt::FramelessWindowHint)) {
        QStyleOptionTitleBar bar;
        d->initStyleOptionTitleBar(&bar);
        QStyle *style = this->style();
        const qreal margin = style->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, &bar);
        qreal titleBarHeight  = d->titleBarHeight(bar);
        setWindowFrameMargins(margin, titleBarHeight, margin, margin);
    } else {
        setWindowFrameMargins(0, 0, 0, 0);
    }
    d->setWindowFrameMargins = false;
}